

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASELoader.cpp
# Opt level: O0

void CopyASETexture(aiMaterial *mat,Texture *texture,aiTextureType type)

{
  bool bVar1;
  undefined1 local_420 [8];
  aiString tex;
  aiTextureType type_local;
  Texture *texture_local;
  aiMaterial *mat_local;
  
  tex.data._1016_4_ = type;
  unique0x100000da = texture;
  aiString::aiString((aiString *)local_420);
  aiString::Set((aiString *)local_420,&stack0xffffffffffffffe8->mMapName);
  aiMaterial::AddProperty(mat,(aiString *)local_420,"$tex.file",tex.data._1016_4_,0);
  bVar1 = is_not_qnan<float>(stack0xffffffffffffffe8->mTextureBlend);
  if (bVar1) {
    aiMaterial::AddProperty<float>
              (mat,&stack0xffffffffffffffe8->mTextureBlend,1,"$tex.blend",tex.data._1016_4_,0);
  }
  aiMaterial::AddProperty<float>
            (mat,&stack0xffffffffffffffe8->mOffsetU,5,"$tex.uvtrafo",tex.data._1016_4_,0);
  return;
}

Assistant:

void CopyASETexture(aiMaterial& mat, ASE::Texture& texture, aiTextureType type)
{
    // Setup the texture name
    aiString tex;
    tex.Set( texture.mMapName);
    mat.AddProperty( &tex, AI_MATKEY_TEXTURE(type,0));

    // Setup the texture blend factor
    if (is_not_qnan(texture.mTextureBlend))
        mat.AddProperty<ai_real>( &texture.mTextureBlend, 1, AI_MATKEY_TEXBLEND(type,0));

    // Setup texture UV transformations
    mat.AddProperty<ai_real>(&texture.mOffsetU,5,AI_MATKEY_UVTRANSFORM(type,0));
}